

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Inversion * __thiscall
OpenMD::SelectionManager::beginUnselectedInversion(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppIVar2;
  int *in_RSI;
  long in_RDI;
  OpenMDBitSet *in_stack_ffffffffffffffe0;
  value_type pIVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RDI + 8),4);
  iVar1 = OpenMDBitSet::firstOffBit(in_stack_ffffffffffffffe0);
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pIVar3 = (value_type)0x0;
  }
  else {
    ppIVar2 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                        ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                         (in_RDI + 0x98),(long)*in_RSI);
    pIVar3 = *ppIVar2;
  }
  return pIVar3;
}

Assistant:

Inversion* SelectionManager::beginUnselectedInversion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[INVERSION].size())) {
      if (!ss_.bitsets_[INVERSION][i]) {
        // check that this processor owns this inversion
        if (inversions_[i] != NULL) return inversions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[INVERSION].firstOffBit();
    return i == -1 ? NULL : inversions_[i];
#endif
  }